

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.h
# Opt level: O2

RepeatedField<float> * __thiscall
google::protobuf::Reflection::GetRaw<google::protobuf::RepeatedField<float>>
          (Reflection *this,Message *message,FieldDescriptor *field)

{
  bool bVar1;
  uint32_t uVar2;
  LogMessage *pLVar3;
  LogFinisher local_59;
  LogMessage local_58;
  
  bVar1 = internal::ReflectionSchema::InRealOneof(&this->schema_,field);
  if (bVar1) {
    bVar1 = HasOneofField(this,message,field);
    if (!bVar1) {
      internal::LogMessage::LogMessage
                (&local_58,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/message.h"
                 ,0x5c5);
      pLVar3 = internal::LogMessage::operator<<
                         (&local_58,
                          "CHECK failed: !schema_.InRealOneof(field) || HasOneofField(message, field): "
                         );
      pLVar3 = internal::LogMessage::operator<<(pLVar3,"Field = ");
      pLVar3 = internal::LogMessage::operator<<(pLVar3,(string *)(*(long *)(field + 8) + 0x20));
      internal::LogFinisher::operator=(&local_59,pLVar3);
      internal::LogMessage::~LogMessage(&local_58);
    }
  }
  uVar2 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
  return (RepeatedField<float> *)
         ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar2);
}

Assistant:

const Type& Reflection::GetRaw(const Message& message,
                               const FieldDescriptor* field) const {
  GOOGLE_DCHECK(!schema_.InRealOneof(field) || HasOneofField(message, field))
      << "Field = " << field->full_name();
  return internal::GetConstRefAtOffset<Type>(message,
                                             schema_.GetFieldOffset(field));
}